

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Param::set_value(Param *this,int64_t new_value)

{
  _Hash_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_a0;
  pointer local_80;
  pointer ppIStack_78;
  Param *local_60;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  allocator_type local_29;
  
  if ((new_value < 1) && ((this->param_vars_width_)._M_h._M_element_count != 0)) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    (*(this->super_Const).super_Var.super_IRNode._vptr_IRNode[0x1f])(&local_80,this);
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = local_80;
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIStack_78;
    format_str.size_ = 0x3d;
    format_str.data_ = (char *)0x4f;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_58;
    local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)new_value;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_a0,
               (detail *)
               "{0} is used for parametrizing variable width, thus cannot be non-positive ({1})",
               format_str,args);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_60;
    local_60 = this;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_58,__l,&local_29);
    VarException::VarException(this_00,&local_a0,&local_58);
    __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  Const::set_value(&this->super_Const,new_value);
  this->has_value_ = true;
  for (p_Var1 = (this->param_vars_width_)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    *(int *)&p_Var1[1]._M_nxt[0x13]._M_nxt = (int)new_value;
  }
  for (p_Var2 = (this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    Var::set_size_param((Var *)p_Var2[1]._M_left,*(uint32_t *)&p_Var2[1]._M_parent,
                        *(Var **)(p_Var2 + 1));
  }
  for (p_Var1 = (this->param_params_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[0x2b]._M_nxt)(p_Var1[1]._M_nxt,new_value);
  }
  return;
}

Assistant:

void Param::set_value(int64_t new_value) {
    if (new_value <= 0 && !param_vars_width_.empty()) {
        throw VarException(
            ::format(
                "{0} is used for parametrizing variable width, thus cannot be non-positive ({1})",
                to_string(), new_value),
            {this});
    }
    Const::set_value(new_value);
    has_value_ = true;

    // change the width of parametrized variables
    for (const auto &var : param_vars_width_) {
        var->var_width() = new_value;
    }
    // change the size as well
    for (const auto &[var, index, expr] : param_vars_size_) {
        var->set_size_param(index, expr);
    }

    // change the entire chain
    for (const auto &param : param_params_) {
        param->set_value(new_value);
    }
}